

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::ConvertCamera(FBXConverter *this,Camera *cam,string *orig_name)

{
  ulong __n;
  aiCamera *paVar1;
  float fVar2;
  float fVar3;
  aiCamera *local_38;
  
  paVar1 = (aiCamera *)operator_new(0x438);
  (paVar1->mName).length = 0;
  (paVar1->mName).data[0] = '\0';
  memset((paVar1->mName).data + 1,0x1b,0x3ff);
  (paVar1->mPosition).x = 0.0;
  (paVar1->mPosition).y = 0.0;
  *(undefined8 *)&(paVar1->mPosition).z = 0;
  (paVar1->mUp).y = 1.0;
  (paVar1->mUp).z = 0.0;
  (paVar1->mLookAt).x = 0.0;
  (paVar1->mLookAt).y = 0.0;
  *(undefined8 *)&(paVar1->mLookAt).z = 0x3f490fdb3f800000;
  paVar1->mClipPlaneNear = 0.1;
  paVar1->mClipPlaneFar = 1000.0;
  paVar1->mAspect = 0.0;
  local_38 = paVar1;
  std::vector<aiCamera*,std::allocator<aiCamera*>>::emplace_back<aiCamera*>
            ((vector<aiCamera*,std::allocator<aiCamera*>> *)&this->cameras,&local_38);
  paVar1 = (this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  __n = orig_name->_M_string_length;
  if (__n < 0x400) {
    (paVar1->mName).length = (ai_uint32)__n;
    memcpy((paVar1->mName).data,(orig_name->_M_dataplus)._M_p,__n);
    (paVar1->mName).data[__n] = '\0';
  }
  fVar2 = Camera::AspectWidth(cam);
  fVar3 = Camera::AspectHeight(cam);
  paVar1->mAspect = fVar2 / fVar3;
  (paVar1->mLookAt).z = 0.0;
  (paVar1->mPosition).x = 0.0;
  (paVar1->mPosition).y = 0.0;
  *(undefined8 *)&(paVar1->mPosition).z = 0;
  (paVar1->mUp).y = 1.0;
  (paVar1->mUp).z = 0.0;
  (paVar1->mLookAt).x = 1.0;
  (paVar1->mLookAt).y = 0.0;
  fVar2 = Camera::FieldOfView(cam);
  paVar1->mHorizontalFOV = fVar2 * 0.017453292;
  fVar2 = Camera::NearPlane(cam);
  paVar1->mClipPlaneNear = fVar2;
  fVar2 = Camera::FarPlane(cam);
  paVar1->mClipPlaneFar = fVar2;
  fVar2 = Camera::FieldOfView(cam);
  paVar1->mHorizontalFOV = fVar2 * 0.017453292;
  fVar2 = Camera::NearPlane(cam);
  paVar1->mClipPlaneNear = fVar2;
  fVar2 = Camera::FarPlane(cam);
  paVar1->mClipPlaneFar = fVar2;
  return;
}

Assistant:

void FBXConverter::ConvertCamera(const Camera& cam, const std::string &orig_name)
        {
            cameras.push_back(new aiCamera());
            aiCamera* const out_camera = cameras.back();

            out_camera->mName.Set(orig_name);

            out_camera->mAspect = cam.AspectWidth() / cam.AspectHeight();

            out_camera->mPosition = aiVector3D(0.0f);
            out_camera->mLookAt = aiVector3D(1.0f, 0.0f, 0.0f);
            out_camera->mUp = aiVector3D(0.0f, 1.0f, 0.0f);

            out_camera->mHorizontalFOV = AI_DEG_TO_RAD(cam.FieldOfView());

            out_camera->mClipPlaneNear = cam.NearPlane();
            out_camera->mClipPlaneFar = cam.FarPlane();

            out_camera->mHorizontalFOV = AI_DEG_TO_RAD(cam.FieldOfView());
            out_camera->mClipPlaneNear = cam.NearPlane();
            out_camera->mClipPlaneFar = cam.FarPlane();
        }